

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O2

CURLcode smb_send_and_recv(Curl_easy *data,void **msg)

{
  size_t *psVar1;
  timediff_t *ptVar2;
  connectdata *pcVar3;
  connectdata *pcVar4;
  char *pcVar5;
  size_t sVar6;
  unsigned_short uVar7;
  CURLcode CVar8;
  size_t in_RAX;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  size_t blen;
  size_t nread;
  
  pcVar3 = data->conn;
  *msg = (void *)0x0;
  nread = in_RAX;
  if ((pcVar3->proto).ftpc.pp.sendbuf.bufr == (char *)0x0) {
    uVar9 = (pcVar3->proto).ftpc.pp.response_time;
    if (uVar9 == 0) goto LAB_0057a286;
    nread = (size_t)(data->set).upload_buffer_size;
    if (uVar9 < nread) {
      nread = uVar9;
    }
    (data->req).upload_fromhere = (data->state).ulbuf;
    CVar8 = Curl_fillreadbuffer(data,nread,&nread);
    if ((CVar8 != CURLE_AGAIN) && (CVar8 != CURLE_OK)) {
      return CVar8;
    }
    if (nread == 0) {
      return CURLE_OK;
    }
    ptVar2 = &(pcVar3->proto).ftpc.pp.response_time;
    *ptVar2 = *ptVar2 - nread;
    (pcVar3->proto).ftpc.pp.sendbuf.bufr = (char *)nread;
    (pcVar3->proto).ftpc.pp.sendbuf.leng = 0;
  }
  pcVar4 = data->conn;
  pcVar5 = (pcVar4->proto).ftpc.pp.sendbuf.bufr;
  if (pcVar5 != (char *)0x0) {
    sVar6 = (pcVar4->proto).ftpc.pp.sendbuf.leng;
    blen = (long)pcVar5 - sVar6;
    CVar8 = Curl_nwrite(data,0,(data->state).ulbuf + sVar6,blen,(ssize_t *)&nread);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    if (nread == blen) {
      (pcVar4->proto).ftpc.pp.sendbuf.bufr = (char *)0x0;
    }
    else {
      psVar1 = &(pcVar4->proto).ftpc.pp.sendbuf.leng;
      *psVar1 = *psVar1 + nread;
    }
  }
  if ((pcVar3->proto).ftpc.pp.sendbuf.bufr != (char *)0x0) {
    return CURLE_AGAIN;
  }
  if ((pcVar3->proto).ftpc.pp.response_time != 0) {
    return CURLE_AGAIN;
  }
LAB_0057a286:
  pcVar3 = data->conn;
  pcVar5 = (pcVar3->proto).smbc.recv_buf;
  sVar6 = (pcVar3->proto).ftpc.pp.sendbuf.allc;
  CVar8 = Curl_read(data,pcVar3->sock[0],pcVar5 + sVar6,0x9000 - sVar6,(ssize_t *)&nread);
  if (((CVar8 == CURLE_OK) && (CVar8 = CURLE_OK, nread != 0)) &&
     (uVar9 = nread + (pcVar3->proto).ftpc.pp.sendbuf.allc,
     (pcVar3->proto).ftpc.pp.sendbuf.allc = uVar9, 3 < uVar9)) {
    uVar7 = Curl_read16_be((uchar *)(pcVar5 + 2));
    if ((ulong)uVar7 + 4 <= (pcVar3->proto).ftpc.pp.sendbuf.allc) {
      if (0x20 < uVar7) {
        uVar10 = (uint)(byte)pcVar5[0x24] * 2 + 0x27;
        uVar11 = (uint)((ulong)uVar7 + 4);
        if ((uVar10 <= uVar11) &&
           (uVar7 = Curl_read16_le((uchar *)(pcVar5 + (ulong)((uint)(byte)pcVar5[0x24] * 2) + 0x25))
           , uVar11 < uVar10 + uVar7)) {
          return CURLE_READ_ERROR;
        }
      }
      *msg = pcVar5;
    }
  }
  return CVar8;
}

Assistant:

static CURLcode smb_send_and_recv(struct Curl_easy *data, void **msg)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;
  *msg = NULL; /* if it returns early */

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    size_t nread = smbc->upload_size > (size_t)data->set.upload_buffer_size ?
      (size_t)data->set.upload_buffer_size : smbc->upload_size;
    data->req.upload_fromhere = data->state.ulbuf;
    result = Curl_fillreadbuffer(data, nread, &nread);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(data);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(data, msg);
}